

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O1

void __thiscall fasttext::Dictionary::threshold(Dictionary *this,int64_t t,int64_t tl)

{
  int iVar1;
  pointer peVar2;
  pointer __s;
  pointer piVar3;
  int32_t iVar4;
  pointer peVar5;
  long lVar6;
  __normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
  __i;
  vector<int,_std::allocator<int>_> *pvVar7;
  iterator iVar8;
  pointer peVar9;
  
  peVar9 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
           _M_impl.super__Vector_impl_data._M_start;
  peVar2 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (peVar9 != peVar2) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<fasttext::entry*,std::vector<fasttext::entry,std::allocator<fasttext::entry>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::Dictionary::threshold(long,long)::__0>>
              (peVar9,peVar2,
               (int)LZCOUNT(((long)peVar2 - (long)peVar9 >> 3) * -0x71c71c71c71c71c7) * 2 ^ 0x7e);
    if ((long)peVar2 - (long)peVar9 < 0x481) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<fasttext::entry*,std::vector<fasttext::entry,std::allocator<fasttext::entry>>>,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::Dictionary::threshold(long,long)::__0>>
                (peVar9,peVar2);
    }
    else {
      peVar5 = peVar9 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<fasttext::entry*,std::vector<fasttext::entry,std::allocator<fasttext::entry>>>,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::Dictionary::threshold(long,long)::__0>>
                (peVar9,peVar5);
      for (; peVar5 != peVar2; peVar5 = peVar5 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<fasttext::entry*,std::vector<fasttext::entry,std::allocator<fasttext::entry>>>,__gnu_cxx::__ops::_Val_comp_iter<fasttext::Dictionary::threshold(long,long)::__0>>
                  (peVar5);
      }
    }
  }
  peVar9 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
           _M_impl.super__Vector_impl_data._M_start;
  peVar2 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar6 = ((long)peVar2 - (long)peVar9 >> 3) * -0x71c71c71c71c71c7 >> 2;
  peVar5 = peVar9;
  if (0 < lVar6) {
    peVar5 = peVar9 + lVar6 * 4;
    lVar6 = lVar6 + 1;
    iVar8._M_current = peVar9 + 2;
    do {
      if (iVar8._M_current[-2].type == label) {
        if (iVar8._M_current[-2].count < tl) goto LAB_0011da16;
      }
      else if ((iVar8._M_current[-2].type == word) && (iVar8._M_current[-2].count < t)) {
LAB_0011da16:
        iVar8._M_current = iVar8._M_current + -2;
        goto LAB_0011da29;
      }
      if (iVar8._M_current[-1].type == label) {
        if (iVar8._M_current[-1].count < tl) goto LAB_0011da1f;
      }
      else if ((iVar8._M_current[-1].type == word) && (iVar8._M_current[-1].count < t)) {
LAB_0011da1f:
        iVar8._M_current = iVar8._M_current + -1;
        goto LAB_0011da29;
      }
      if ((iVar8._M_current)->type == label) {
        if ((iVar8._M_current)->count < tl) goto LAB_0011da29;
      }
      else if (((iVar8._M_current)->type == word) && ((iVar8._M_current)->count < t))
      goto LAB_0011da29;
      if (iVar8._M_current[1].type == label) {
        if (iVar8._M_current[1].count < tl) goto LAB_0011da25;
      }
      else if ((iVar8._M_current[1].type == word) && (iVar8._M_current[1].count < t)) {
LAB_0011da25:
        iVar8._M_current = iVar8._M_current + 1;
        goto LAB_0011da29;
      }
      lVar6 = lVar6 + -1;
      iVar8._M_current = iVar8._M_current + 4;
    } while (1 < lVar6);
  }
  lVar6 = ((long)peVar2 - (long)peVar5 >> 3) * -0x71c71c71c71c71c7;
  iVar8._M_current = peVar2;
  if (lVar6 == 1) {
LAB_0011d9eb:
    if (peVar5->type == label) {
      if (tl <= peVar5->count) {
        peVar5 = peVar2;
      }
    }
    else if ((peVar5->type != word) || (t <= peVar5->count)) goto LAB_0011da29;
  }
  else if (lVar6 == 2) {
LAB_0011d9c9:
    if (peVar5->type == label) {
      if (tl <= peVar5->count) goto LAB_0011d9e7;
    }
    else if ((peVar5->type != word) || (t <= peVar5->count)) {
LAB_0011d9e7:
      peVar5 = peVar5 + 1;
      goto LAB_0011d9eb;
    }
  }
  else {
    if (lVar6 != 3) goto LAB_0011da29;
    if (peVar5->type == label) {
      if (tl <= peVar5->count) {
LAB_0011d9c5:
        peVar5 = peVar5 + 1;
        goto LAB_0011d9c9;
      }
    }
    else if ((peVar5->type != word) || (t <= peVar5->count)) goto LAB_0011d9c5;
  }
  iVar8._M_current = peVar5;
LAB_0011da29:
  if (iVar8._M_current + 1 != peVar2 && iVar8._M_current != peVar2) {
    pvVar7 = &iVar8._M_current[1].subwords;
    do {
      if (*(char *)((long)(pvVar7 + -1) + 0x10) == '\x01') {
        if (tl <= *(long *)((long)(pvVar7 + -1) + 8)) goto LAB_0011da68;
      }
      else if ((*(char *)((long)(pvVar7 + -1) + 0x10) != '\0') ||
              (t <= *(long *)((long)(pvVar7 + -1) + 8))) {
LAB_0011da68:
        std::__cxx11::string::operator=((string *)iVar8._M_current,(string *)(pvVar7 + -2));
        (iVar8._M_current)->count = *(int64_t *)((long)(pvVar7 + -1) + 8);
        (iVar8._M_current)->type = *(entry_type *)((long)(pvVar7 + -1) + 0x10);
        std::vector<int,_std::allocator<int>_>::_M_move_assign(&(iVar8._M_current)->subwords,pvVar7)
        ;
        iVar8._M_current = iVar8._M_current + 1;
      }
      peVar9 = (pointer)(pvVar7 + 1);
      pvVar7 = pvVar7 + 3;
    } while (peVar9 != peVar2);
  }
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::_M_erase
            (&this->words_,iVar8,
             (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  if ((this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>,_true>::
    _S_do_it(&this->words_);
  }
  this->size_ = 0;
  this->nwords_ = 0;
  this->nlabels_ = 0;
  __s = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start;
  piVar3 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s != piVar3) {
    memset(__s,0xff,((long)piVar3 + (-4 - (long)__s) & 0xfffffffffffffffcU) + 4);
  }
  peVar2 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (peVar9 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>
                ._M_impl.super__Vector_impl_data._M_start; peVar9 != peVar2; peVar9 = peVar9 + 1) {
    iVar4 = find(this,&peVar9->word);
    iVar1 = this->size_;
    this->size_ = iVar1 + 1;
    __s[iVar4] = iVar1;
    if (peVar9->type == label) {
      this->nlabels_ = this->nlabels_ + 1;
    }
    else if (peVar9->type == word) {
      this->nwords_ = this->nwords_ + 1;
    }
  }
  return;
}

Assistant:

void Dictionary::threshold(int64_t t, int64_t tl) {
  sort(words_.begin(), words_.end(), [](const entry& e1, const entry& e2) {
    if (e1.type != e2.type) {
      return e1.type < e2.type;
    }
    return e1.count > e2.count;
  });
  words_.erase(
      remove_if(
          words_.begin(),
          words_.end(),
          [&](const entry& e) {
            return (e.type == entry_type::word && e.count < t) ||
                (e.type == entry_type::label && e.count < tl);
          }),
      words_.end());
  words_.shrink_to_fit();
  size_ = 0;
  nwords_ = 0;
  nlabels_ = 0;
  std::fill(word2int_.begin(), word2int_.end(), -1);
  for (auto it = words_.begin(); it != words_.end(); ++it) {
    int32_t h = find(it->word);
    word2int_[h] = size_++;
    if (it->type == entry_type::word) {
      nwords_++;
    }
    if (it->type == entry_type::label) {
      nlabels_++;
    }
  }
}